

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

void capnp::_::anon_unknown_0::doForwardingTest(bool allowForwarding,bool addReflectionLeg)

{
  Vat *this;
  ReadLimiter *pRVar1;
  PipelineHook *pPVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ArrayPtr<kj::String> argValues;
  ArrayPtr<kj::String> argValues_00;
  TestVat *network;
  CapTableBuilder *pCVar5;
  Entry *pEVar6;
  TestNoTailForwarder *this_00;
  size_t __n;
  void *__buf;
  nfds_t __nfds;
  void *__buf_00;
  char (*params) [79];
  DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
  *params_00;
  char (*params_01) [80];
  DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
  *params_02;
  undefined7 in_register_00000039;
  undefined1 unique;
  char *params_03;
  DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *in_R9;
  long lVar7;
  StringPtr to;
  StringPtr to_00;
  StringPtr to_01;
  StringPtr to_02;
  StringPtr name;
  StringPtr name_00;
  StringPtr key;
  StringPtr name_01;
  char *pcVar8;
  undefined *puVar9;
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  req;
  Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> holdBouncer;
  Own<capnp::RequestHook,_std::nullptr_t> local_388;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_378 [3];
  int eveHandleCount;
  int eveCallCount;
  Client daveCap;
  Client bobCap;
  Own<capnp::_::(anonymous_namespace)::TestNoTailForwarder,_std::nullptr_t> local_328 [2];
  Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> local_308;
  undefined1 local_2f8 [24];
  Own<capnp::ClientHook,_std::nullptr_t> local_2e0;
  Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> local_2d0;
  int carolHandleCount;
  int carolCallCount;
  char *local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  char *local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined1 local_288 [48];
  Maybe<capnp::MessageSize> local_258;
  Maybe<capnp::MessageSize> local_240;
  Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_> local_228 [6];
  Own<capnp::ResponseHook,_std::nullptr_t> local_1f8;
  TestContext context;
  
  TestContext::TestContext(&context);
  local_378[2].ptr._4_4_ = (undefined4)CONCAT71(in_register_00000039,allowForwarding);
  local_328[1].disposer = (Disposer *)context.alice;
  local_328[1].ptr = (TestNoTailForwarder *)context.bob;
  carolCallCount = 0;
  carolHandleCount = 0;
  context.network.forwardingEnabled = allowForwarding;
  kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>
            ((kj *)&local_308,&carolCallCount,&carolHandleCount);
  name.content.size_ = 6;
  name.content.ptr = "carol";
  local_378[1].ptr =
       (PromiseNode *)
       (anonymous_namespace)::TestContext::
       initVat<kj::Own<capnp::_::TestMoreStuffImpl,decltype(nullptr)>>
                 ((TestContext *)&context,name,&local_308);
  kj::Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t>::dispose(&local_308);
  eveCallCount = 0;
  eveHandleCount = 0;
  daveCap._0_8_ = anon_var_dwarf_2442a3;
  daveCap._8_8_ = s_operator___0042678a;
  daveCap._16_8_ = 0x100000087d;
  kj::newPromiseAndFulfiller<capnp::Capability::Client>(stack0xfffffffffffffc30);
  local_378[0].ptr = (PromiseNode *)bobCap._vptr_Client;
  bobCap._vptr_Client = (_func_int **)0x0;
  name_00.content.size_ = 5;
  name_00.content.ptr = "dave";
  network = TestNetwork::add(&context.network,name_00);
  pCVar5 = (CapTableBuilder *)operator_new(0x18);
  holdBouncer.ptr._0_8_ = local_378[0].ptr;
  local_378[0].ptr = (PromiseNode *)0x0;
  (pCVar5->super_CapTableReader)._vptr_CapTableReader = (_func_int **)network;
  Capability::Client::Client<capnp::Capability::Client,void>
            ((Client *)&req,(Promise<capnp::Capability::Client> *)&holdBouncer);
  makeRpcServer<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>
            ((capnp *)(pCVar5 + 1),&network->super_TestVatBase,(Client *)&req);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&req);
  req.super_Builder._builder.segment =
       (SegmentBuilder *)
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestContext::Vat>::instance;
  req.super_Builder._builder.capTable = pCVar5;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&holdBouncer);
  key.content.size_ = 5;
  key.content.ptr = "dave";
  pEVar6 = kj::
           HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t>_>
           ::insert(&context.vats,key,
                    (Own<capnp::_::(anonymous_namespace)::TestContext::Vat,_std::nullptr_t> *)&req);
  this = (pEVar6->value).ptr;
  if (req.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    (*(code *)(((req.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena)();
  }
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(local_378);
  holdBouncer.ptr._0_8_ = holdBouncer.ptr._0_8_ & 0xffffffffffffff00;
  if (addReflectionLeg) {
    kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>((kj *)&local_2d0,&eveCallCount,&eveHandleCount);
    name_01.content.size_ = 4;
    name_01.content.ptr = "eve";
    (anonymous_namespace)::TestContext::
    initVat<kj::Own<capnp::_::TestMoreStuffImpl,decltype(nullptr)>>
              ((TestContext *)&context,name_01,&local_2d0);
    kj::Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t>::dispose(&local_2d0);
    to.content.size_ = 4;
    to.content.ptr = "eve";
    TestContext::Vat::connect<capnproto_test::capnp::test::TestMoreStuff>
              ((Client *)&req,this,to,false);
    kj::_::NullableValue<capnproto_test::capnp::test::TestMoreStuff::Client>::
    emplace<capnproto_test::capnp::test::TestMoreStuff::Client>(&holdBouncer.ptr,(Client *)&req);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)&req.super_Builder._builder.capTable);
  }
  unique = 0;
  to_00.content.size_ = 6;
  to_00.content.ptr = "carol";
  TestContext::Vat::connect<capnproto_test::capnp::test::TestMoreStuff>
            ((Client *)local_2f8,this,to_00,false);
  this_00 = (TestNoTailForwarder *)operator_new(0x50);
  lVar7 = *(long *)(local_2f8._0_8_ + -0x18);
  pPVar2 = *(PipelineHook **)(local_2f8 + lVar7 + 8);
  *(undefined8 *)(local_2f8 + lVar7 + 8) = 0;
  local_288._8_8_ = *(size_t *)(local_2f8 + lVar7);
  local_288._0_8_ = &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  local_288._16_8_ = pPVar2;
  kj::Maybe<capnproto_test::capnp::test::TestMoreStuff::Client>::Maybe
            ((Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *)&req,&holdBouncer);
  *(undefined8 *)&this_00->field_0x48 = 0;
  *(undefined8 *)&this_00->super_Server = 0x651068;
  *(undefined8 *)&this_00->field_0x40 = 0x6510a0;
  capnproto_test::capnp::test::TestMoreStuff::Server::Server
            ((Server *)this_00,&PTR_construction_vtable_48__00650f00);
  *(undefined8 *)&this_00->field_0x40 = 0x650ee0;
  *(undefined8 *)&this_00->super_Server = 0x650e20;
  pRVar1 = *(ReadLimiter **)(local_288._0_8_ + -0x18);
  uVar3 = *(undefined8 *)(local_288 + (long)pRVar1);
  uVar4 = *(undefined8 *)(local_288 + 8 + (long)pRVar1);
  *(undefined8 *)(local_288 + 8 + (long)pRVar1) = 0;
  *(undefined8 *)&(this_00->super_Server).field_0x10 = uVar3;
  *(undefined8 *)&this_00->field_0x18 = uVar4;
  *(pointer_____offset_0x10___ **)&(this_00->super_Server).field_0x8 =
       &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  kj::Maybe<capnproto_test::capnp::test::TestMoreStuff::Client>::Maybe
            (&this_00->holdBouncer,(Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *)&req
            );
  local_328[0].disposer =
       (Disposer *)
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestNoTailForwarder>::instance;
  local_328[0].ptr = this_00;
  kj::_::NullableValue<capnproto_test::capnp::test::TestMoreStuff::Client>::~NullableValue
            ((NullableValue<capnproto_test::capnp::test::TestMoreStuff::Client> *)&req);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_288 + 8));
  req.super_Builder._builder.capTable = (CapTableBuilder *)&this_00->field_0x40;
  req.super_Builder._builder.segment =
       (SegmentBuilder *)
       &kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestNoTailForwarder>::instance;
  local_328[0].ptr = (TestNoTailForwarder *)0x0;
  Capability::Client::makeLocalClient
            ((Client *)&local_2e0,(Own<capnp::Capability::Server,_std::nullptr_t> *)&req);
  kj::Own<capnp::Capability::Server,_std::nullptr_t>::dispose
            ((Own<capnp::Capability::Server,_std::nullptr_t> *)&req);
  (**(code **)(*(long *)bobCap._16_8_ + 0x10))(bobCap._16_8_,&local_2e0);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose(&local_2e0);
  kj::Own<capnp::_::(anonymous_namespace)::TestNoTailForwarder,_std::nullptr_t>::~Own(local_328);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_2f8 + 8));
  kj::_::NullableValue<capnproto_test::capnp::test::TestMoreStuff::Client>::~NullableValue
            (&holdBouncer.ptr);
  kj::PromiseFulfillerPair<capnp::Capability::Client>::~PromiseFulfillerPair
            ((PromiseFulfillerPair<capnp::Capability::Client> *)&bobCap);
  to_01.content.size_ = 4;
  to_01.content.ptr = "bob";
  TestContext::Vat::connect<capnproto_test::capnp::test::TestInterface>
            (&bobCap,context.alice,to_01,(bool)unique);
  __n = 5;
  params_03 = (char *)0x0;
  to_02.content.size_ = 5;
  to_02.content.ptr = "dave";
  TestContext::Vat::connect<capnproto_test::capnp::test::TestMoreStuff>
            (&daveCap,context.alice,to_02,false);
  local_240.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::holdRequest(&req,&daveCap,&local_240);
  capnproto_test::capnp::test::TestMoreStuff::HoldParams::Builder::setCap
            (&req.super_Builder,&bobCap);
  Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
          *)&holdBouncer,(int)&req,__buf,__n,(int)params_03);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  uStack_298 = &DAT_00453050;
  local_290 = (void *)0x500000895;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::HoldResults>_>::wait
            (local_228,&holdBouncer);
  kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&local_1f8);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::HoldResults> *)&holdBouncer)
  ;
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&req.hook);
  kj::WaitScope::poll(&context.waitScope,(pollfd *)0xffffffffffffffff,__nfds,(int)__n);
  local_258.ptr.isSet = false;
  capnproto_test::capnp::test::TestMoreStuff::Client::callHeldRequest
            ((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
              *)&holdBouncer,&daveCap,&local_258);
  Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  ::send((Request<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
          *)local_288,(int)&holdBouncer,__buf_00,__n,(int)params_03);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  uStack_2b0 = &DAT_00453050;
  local_2a8 = (void *)0x110000089e;
  pcVar8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
  ;
  puVar9 = &DAT_00453050;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
              *)&req,local_288);
  RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults> *)local_288
            );
  kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&local_388);
  local_288._0_16_ =
       (undefined1  [16])
       capnproto_test::capnp::test::TestMoreStuff::CallHeldResults::Reader::getS((Reader *)&req);
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            ((DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)&holdBouncer,
             (DebugExpression<capnp::Text::Reader> *)local_288,(char (*) [4])0x45cd55);
  if (((bool)local_388.disposer._0_1_ == false) && (kj::_::Debug::minSeverity < 3)) {
    params_03 = "failed: expected resp.getS() == \"bar\"";
    in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)&holdBouncer;
    kj::_::Debug::
    log<char_const(&)[38],kj::_::DebugComparison<capnp::Text::Reader,char_const(&)[4]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,0x89f,ERROR,"\"failed: expected \" \"resp.getS() == \\\"bar\\\"\", _kjCondition",
               (char (*) [38])"failed: expected resp.getS() == \"bar\"",in_R9);
  }
  kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose
            ((Own<capnp::ResponseHook,_std::nullptr_t> *)&req.hook.ptr);
  TestVat::getConnectionTo((TestVat *)&req,this->vatNetwork);
  holdBouncer.ptr._0_8_ = req.super_Builder._builder.segment;
  holdBouncer.ptr.field_1._0_8_ = &kj::none;
  holdBouncer.ptr.field_1._8_8_ = anon_var_dwarf_43885;
  holdBouncer.ptr.field_1._16_8_ = 5;
  if ((req.super_Builder._builder.segment == (SegmentBuilder *)0x0) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::str<char_const(&)[79]>
              ((String *)&req,
               (kj *)
               "failed: expected dave.vatNetwork.getConnectionTo(carol.vatNetwork) != kj::none",
               params);
    kj::
    str<kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
              ((String *)&req.super_Builder._builder.pointers,(kj *)&holdBouncer,params_00);
    params_03 = (char *)&req;
    in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)0x2;
    argValues.size_ = (size_t)puVar9;
    argValues.ptr = (String *)pcVar8;
    kj::_::Debug::logInternal
              ((Debug *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,(char *)0x8a3,2,0x453061,params_03,argValues);
    lVar7 = 0x18;
    do {
      kj::Array<char>::~Array((Array<char> *)((long)&req.super_Builder._builder.segment + lVar7));
      lVar7 = lVar7 + -0x18;
    } while (lVar7 != -0x18);
  }
  TestVat::getConnectionTo
            ((TestVat *)&holdBouncer,*(TestVat **)&(local_378[1].ptr)->super_PromiseArenaMember);
  req.super_Builder._builder.segment = (SegmentBuilder *)holdBouncer.ptr._0_8_;
  req.super_Builder._builder.capTable = (CapTableBuilder *)&kj::none;
  req.super_Builder._builder.data = anon_var_dwarf_43885;
  req.super_Builder._builder.pointers = (WirePointer *)&DAT_00000005;
  req.super_Builder._builder.dataSize._0_1_ = holdBouncer.ptr._0_8_ != 0;
  if ((!(bool)(undefined1)req.super_Builder._builder.dataSize) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[78],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
              ((char *)0x8a4,0x453112,0x453173,(char *)&req,(char (*) [78])params_03,
               (DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                *)in_R9);
  }
  TestVat::getConnectionTo
            ((TestVat *)&req,*(TestVat **)&(local_378[1].ptr)->super_PromiseArenaMember);
  holdBouncer.ptr._0_8_ = req.super_Builder._builder.segment;
  holdBouncer.ptr.field_1._0_8_ = &kj::none;
  holdBouncer.ptr.field_1._8_8_ = anon_var_dwarf_3d166;
  holdBouncer.ptr.field_1._16_8_ = 5;
  if ((req.super_Builder._builder.segment != (SegmentBuilder *)0x0) &&
     (kj::_::Debug::minSeverity < 3)) {
    kj::str<char_const(&)[80]>
              ((String *)&req,
               (kj *)
               "failed: expected carol.vatNetwork.getConnectionTo(alice.vatNetwork) == kj::none",
               params_01);
    kj::
    str<kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
              ((String *)&req.super_Builder._builder.pointers,(kj *)&holdBouncer,params_02);
    params_03 = (char *)&req;
    in_R9 = (DebugComparison<capnp::Text::Reader,_const_char_(&)[4]> *)0x2;
    argValues_00.size_ = (size_t)puVar9;
    argValues_00.ptr = (String *)pcVar8;
    kj::_::Debug::logInternal
              ((Debug *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
               ,(char *)0x8a7,2,0x4531c1,params_03,argValues_00);
    lVar7 = 0x18;
    do {
      kj::Array<char>::~Array((Array<char> *)((long)&req.super_Builder._builder.segment + lVar7));
      lVar7 = lVar7 + -0x18;
    } while (lVar7 != -0x18);
  }
  if (local_378[2].ptr._4_1_ == '\0') {
    TestVat::getConnectionTo((TestVat *)&holdBouncer,this->vatNetwork);
    req.super_Builder._builder.dataSize._0_1_ = holdBouncer.ptr._0_8_ != 0;
    req.super_Builder._builder.segment = (SegmentBuilder *)holdBouncer.ptr._0_8_;
    req.super_Builder._builder.capTable = (CapTableBuilder *)&kj::none;
    req.super_Builder._builder.data = anon_var_dwarf_43885;
    req.super_Builder._builder.pointers = (WirePointer *)&DAT_00000005;
    if (kj::_::Debug::minSeverity < 3 && !(bool)(undefined1)req.super_Builder._builder.dataSize) {
      kj::_::Debug::
      log<char_const(&)[77],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
                ((char *)0x8b2,0x453321,0x453381,(char *)&req,(char (*) [77])params_03,
                 (DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                  *)in_R9);
    }
    req.super_Builder._builder.segment = (SegmentBuilder *)&context.network.forwardCount;
    req.super_Builder._builder.capTable =
         (CapTableBuilder *)((ulong)req.super_Builder._builder.capTable & 0xffffffff00000000);
    req.super_Builder._builder.dataSize._0_1_ = context.network.forwardCount == 0;
    req.super_Builder._builder.data = anon_var_dwarf_3d166;
    req.super_Builder._builder.pointers = (WirePointer *)&DAT_00000005;
    if (kj::_::Debug::minSeverity < 3 && !(bool)(undefined1)req.super_Builder._builder.dataSize) {
      kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x8b5,ERROR,
                 "\"failed: expected \" \"context.network.forwardCount == 0\", _kjCondition",
                 (char (*) [51])"failed: expected context.network.forwardCount == 0",
                 (DebugComparison<unsigned_int_&,_int> *)&req);
    }
    req.super_Builder._builder.segment = (SegmentBuilder *)&context.network.deniedForwardCount;
    req.super_Builder._builder.dataSize._0_1_ = context.network.deniedForwardCount == 1;
    req.super_Builder._builder.capTable =
         (CapTableBuilder *)CONCAT44(req.super_Builder._builder.capTable._4_4_,1);
    req.super_Builder._builder.data = anon_var_dwarf_3d166;
    req.super_Builder._builder.pointers = (WirePointer *)&DAT_00000005;
    if ((!(bool)(undefined1)req.super_Builder._builder.dataSize) && (kj::_::Debug::minSeverity < 3))
    {
      kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x8b6,ERROR,
                 "\"failed: expected \" \"context.network.deniedForwardCount == 1\", _kjCondition",
                 (char (*) [57])"failed: expected context.network.deniedForwardCount == 1",
                 (DebugComparison<unsigned_int_&,_int> *)&req);
    }
  }
  else {
    TestVat::getConnectionTo((TestVat *)&holdBouncer,this->vatNetwork);
    req.super_Builder._builder.dataSize._0_1_ = holdBouncer.ptr._0_8_ == 0;
    req.super_Builder._builder.segment = (SegmentBuilder *)holdBouncer.ptr._0_8_;
    req.super_Builder._builder.capTable = (CapTableBuilder *)&kj::none;
    req.super_Builder._builder.data = anon_var_dwarf_3d166;
    req.super_Builder._builder.pointers = (WirePointer *)&DAT_00000005;
    if (kj::_::Debug::minSeverity < 3 && !(bool)(undefined1)req.super_Builder._builder.dataSize) {
      kj::_::Debug::
      log<char_const(&)[77],kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>,kj::None_const&>&>
                ((char *)0x8ab,0x453274,0x4532d4,(char *)&req,(char (*) [77])params_03,
                 (DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>,_const_kj::None_&>
                  *)in_R9);
    }
    req.super_Builder._builder.segment = (SegmentBuilder *)&context.network.deniedForwardCount;
    req.super_Builder._builder.capTable =
         (CapTableBuilder *)((ulong)req.super_Builder._builder.capTable & 0xffffffff00000000);
    req.super_Builder._builder.dataSize._0_1_ = context.network.deniedForwardCount == 0;
    req.super_Builder._builder.data = anon_var_dwarf_3d166;
    req.super_Builder._builder.pointers = (WirePointer *)&DAT_00000005;
    if ((!(bool)(undefined1)req.super_Builder._builder.dataSize) && (kj::_::Debug::minSeverity < 3))
    {
      kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<unsigned_int&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
                 ,0x8af,ERROR,
                 "\"failed: expected \" \"context.network.deniedForwardCount == 0\", _kjCondition",
                 (char (*) [57])"failed: expected context.network.deniedForwardCount == 0",
                 (DebugComparison<unsigned_int_&,_int> *)&req);
    }
  }
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&daveCap.field_0x8);
  kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
            ((Own<capnp::ClientHook,_std::nullptr_t> *)&bobCap.field_0x8);
  TestContext::~TestContext(&context);
  return;
}

Assistant:

void doForwardingTest(bool allowForwarding, bool addReflectionLeg) {
  TestContext context;
  context.network.forwardingEnabled = allowForwarding;

  // Set up Alice, Bob, Carol, and Dave.
  auto& alice = context.alice;
  auto& bob = context.bob;

  int carolCallCount = 0;
  int carolHandleCount = 0;
  auto& carol = context.initVat("carol",
      kj::heap<TestMoreStuffImpl>(carolCallCount, carolHandleCount));

  int eveCallCount = 0;
  int eveHandleCount = 0;

  // Arrange for Dave to forward all calls to Carol.
  auto& dave = [&]() -> TestContext::Vat& {
    auto paf = kj::newPromiseAndFulfiller<Capability::Client>();
    auto& dave = context.initVat("dave", kj::mv(paf.promise));

    kj::Maybe<test::TestMoreStuff::Client> holdBouncer = kj::none;
    if (addReflectionLeg) {
      // Add a `holdBouncer`, so the capability gets bounced from Dave to Eve and back to Dave
      // again before forwarding on to Carol.
      context.initVat("eve", kj::heap<TestMoreStuffImpl>(eveCallCount, eveHandleCount));
      holdBouncer = dave.connect<test::TestMoreStuff>("eve");
    }

    paf.fulfiller->fulfill(kj::heap<TestNoTailForwarder>(
        dave.connect<test::TestMoreStuff>("carol"), kj::mv(holdBouncer)));
    return dave;
  }();

  // Alice connects to Bob and Dave.
  auto bobCap = context.alice.connect<test::TestInterface>("bob");
  auto daveCap = context.alice.connect<test::TestMoreStuff>("dave");

  // Send `bobCap` to Dave, who sends it on to Carol.
  {
    auto req = daveCap.holdRequest();
    req.setCap(kj::mv(bobCap));
    req.send().wait(context.waitScope);
  }

  // Pump event loop to allow things to settle.
  context.waitScope.poll();

  // Tell Dave to invoke the held capability. Dave forwards to Carol. This forces Carol to connect
  // to Bob.
  {
    auto resp = daveCap.callHeldRequest().send().wait(context.waitScope);
    KJ_EXPECT(resp.getS() == "bar");
  }

  // Dave is connected to Carol, who is connected to Bob.
  KJ_EXPECT(dave.vatNetwork.getConnectionTo(carol.vatNetwork) != kj::none);
  KJ_EXPECT(carol.vatNetwork.getConnectionTo(bob.vatNetwork) != kj::none);

  // Carol never connected to Alice.
  KJ_EXPECT(carol.vatNetwork.getConnectionTo(alice.vatNetwork) == kj::none);

  if (allowForwarding) {
    // Dave never connected to Bob.
    KJ_EXPECT(dave.vatNetwork.getConnectionTo(bob.vatNetwork) == kj::none);

    // Forwarding occurred.
    KJ_EXPECT(context.network.forwardCount == addReflectionLeg ? 3 : 1);
    KJ_EXPECT(context.network.deniedForwardCount == 0);
  } else {
    // Dave had to accept the capability from Bob before forwarding it, so had to connect to bob.
    KJ_EXPECT(dave.vatNetwork.getConnectionTo(bob.vatNetwork) != kj::none);

    // No forwarding occurred.
    KJ_EXPECT(context.network.forwardCount == 0);
    KJ_EXPECT(context.network.deniedForwardCount == 1);
  }
}